

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  size_t *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  key_type kVar1;
  bool bVar2;
  Syntax syntax;
  int iVar3;
  int iVar4;
  Type TVar5;
  char *value;
  size_type sVar6;
  FileDescriptor *pFVar7;
  string *psVar8;
  ulong uVar9;
  FileOptions *options;
  DescriptorPool *pool;
  EnumDescriptor *this_02;
  FieldDescriptor *pFVar10;
  size_type sVar11;
  Descriptor *pDVar12;
  ServiceDescriptor *this_03;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::Descriptor_*>,_bool> pVar13;
  SubstituteArg local_ed0;
  SubstituteArg local_ea0;
  SubstituteArg local_e70;
  SubstituteArg local_e40;
  SubstituteArg local_e10;
  SubstituteArg local_de0;
  SubstituteArg local_db0;
  SubstituteArg local_d80;
  SubstituteArg local_d50;
  SubstituteArg local_d20;
  int local_cec;
  Descriptor *pDStack_ce8;
  int i_5;
  Descriptor *containing_type;
  Descriptor *pDStack_cd8;
  int i_4;
  int local_ccc;
  _Rb_tree_const_iterator<const_google::protobuf::Descriptor_*> _Stack_cc8;
  int i_3;
  undefined1 local_cc0;
  Descriptor *local_cb8;
  int local_cac;
  undefined1 local_ca8 [4];
  int i_2;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  undefined1 local_c70 [4];
  int i_1;
  SubstituteArg local_c40;
  SubstituteArg local_c10;
  SubstituteArg local_be0;
  SubstituteArg local_bb0;
  SubstituteArg local_b80;
  SubstituteArg local_b50;
  SubstituteArg local_b20;
  SubstituteArg local_af0;
  SubstituteArg local_ac0;
  allocator local_a89;
  string local_a88;
  undefined1 local_a68 [8];
  SourceLocationCommentPrinter package_comment;
  vector<int,_std::allocator<int>_> path_1;
  SubstituteArg local_988;
  SubstituteArg local_958;
  SubstituteArg local_928;
  SubstituteArg local_8f8;
  SubstituteArg local_8c8;
  SubstituteArg local_898;
  SubstituteArg local_868;
  SubstituteArg local_838;
  SubstituteArg local_808;
  SubstituteArg local_7d8;
  SubstituteArg local_7a8;
  SubstituteArg local_778;
  SubstituteArg local_748;
  SubstituteArg local_718;
  SubstituteArg local_6e8;
  SubstituteArg local_6b8;
  SubstituteArg local_688;
  SubstituteArg local_658;
  SubstituteArg local_628;
  SubstituteArg local_5f8;
  SubstituteArg local_5c8;
  SubstituteArg local_598;
  SubstituteArg local_568;
  SubstituteArg local_538;
  SubstituteArg local_508;
  SubstituteArg local_4d8;
  SubstituteArg local_4a8;
  SubstituteArg local_478;
  SubstituteArg local_448;
  key_type local_414;
  undefined1 local_410 [4];
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  string local_3a8;
  undefined1 local_388 [8];
  SourceLocationCommentPrinter comment_printer;
  SubstituteArg local_2c0;
  SubstituteArg local_290;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  allocator local_109;
  string local_108;
  undefined1 local_e8 [8];
  SourceLocationCommentPrinter syntax_comment;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> path;
  DebugStringOptions *debug_string_options_local;
  FileDescriptor *this_local;
  string *contents;
  
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,&FileDescriptorProto::kSyntaxFieldNumber)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"",&local_109);
  anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_e8,this,
             (vector<int,_std::allocator<int>_> *)local_40,&local_108,debug_string_options);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_e8,__return_storage_ptr__);
  syntax = FileDescriptor::syntax(this);
  value = SyntaxName(syntax);
  strings::internal::SubstituteArg::SubstituteArg(&local_140,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_170);
  strings::internal::SubstituteArg::SubstituteArg(&local_1a0);
  strings::internal::SubstituteArg::SubstituteArg(&local_1d0);
  strings::internal::SubstituteArg::SubstituteArg(&local_200);
  strings::internal::SubstituteArg::SubstituteArg(&local_230);
  strings::internal::SubstituteArg::SubstituteArg(&local_260);
  strings::internal::SubstituteArg::SubstituteArg(&local_290);
  strings::internal::SubstituteArg::SubstituteArg(&local_2c0);
  strings::internal::SubstituteArg::SubstituteArg
            ((SubstituteArg *)((long)&comment_printer.prefix_.field_2 + 8));
  strings::SubstituteAndAppend
            (__return_storage_ptr__,"syntax = \"$0\";\n\n",&local_140,&local_170,&local_1a0,
             &local_1d0,&local_200,&local_230,&local_260,&local_290,&local_2c0,
             (SubstituteArg *)((long)&comment_printer.prefix_.field_2 + 8));
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_e8,__return_storage_ptr__);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_e8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3a8,"",
             (allocator *)
             ((long)&public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::FileDescriptor>
            ((SourceLocationCommentPrinter *)local_388,this,&local_3a8,debug_string_options);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_388,__return_storage_ptr__);
  this_00 = &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_410);
  std::set<int,std::less<int>,std::allocator<int>>::insert<int*>
            ((set<int,std::less<int>,std::allocator<int>> *)this_00,*(int **)(this + 0x40),
             *(int **)(this + 0x40) + *(int *)(this + 0x38));
  std::set<int,std::less<int>,std::allocator<int>>::insert<int*>
            ((set<int,std::less<int>,std::allocator<int>> *)local_410,*(int **)(this + 0x50),
             *(int **)(this + 0x50) + *(int *)(this + 0x48));
  for (local_414 = 0; kVar1 = local_414, iVar3 = dependency_count(this), kVar1 < iVar3;
      local_414 = local_414 + 1) {
    sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &local_414);
    if (sVar6 == 0) {
      sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_410,&local_414);
      if (sVar6 == 0) {
        pFVar7 = dependency(this,local_414);
        psVar8 = name_abi_cxx11_(pFVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_808,psVar8);
        strings::internal::SubstituteArg::SubstituteArg(&local_838);
        strings::internal::SubstituteArg::SubstituteArg(&local_868);
        strings::internal::SubstituteArg::SubstituteArg(&local_898);
        strings::internal::SubstituteArg::SubstituteArg(&local_8c8);
        strings::internal::SubstituteArg::SubstituteArg(&local_8f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_928);
        strings::internal::SubstituteArg::SubstituteArg(&local_958);
        strings::internal::SubstituteArg::SubstituteArg(&local_988);
        strings::internal::SubstituteArg::SubstituteArg
                  ((SubstituteArg *)
                   &path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import \"$0\";\n",&local_808,&local_838,&local_868,
                   &local_898,&local_8c8,&local_8f8,&local_928,&local_958,&local_988,
                   (SubstituteArg *)
                   &path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pFVar7 = dependency(this,local_414);
        psVar8 = name_abi_cxx11_(pFVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_628,psVar8);
        strings::internal::SubstituteArg::SubstituteArg(&local_658);
        strings::internal::SubstituteArg::SubstituteArg(&local_688);
        strings::internal::SubstituteArg::SubstituteArg(&local_6b8);
        strings::internal::SubstituteArg::SubstituteArg(&local_6e8);
        strings::internal::SubstituteArg::SubstituteArg(&local_718);
        strings::internal::SubstituteArg::SubstituteArg(&local_748);
        strings::internal::SubstituteArg::SubstituteArg(&local_778);
        strings::internal::SubstituteArg::SubstituteArg(&local_7a8);
        strings::internal::SubstituteArg::SubstituteArg(&local_7d8);
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import weak \"$0\";\n",&local_628,&local_658,&local_688,
                   &local_6b8,&local_6e8,&local_718,&local_748,&local_778,&local_7a8,&local_7d8);
      }
    }
    else {
      pFVar7 = dependency(this,local_414);
      psVar8 = name_abi_cxx11_(pFVar7);
      strings::internal::SubstituteArg::SubstituteArg(&local_448,psVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_478);
      strings::internal::SubstituteArg::SubstituteArg(&local_4a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_4d8);
      strings::internal::SubstituteArg::SubstituteArg(&local_508);
      strings::internal::SubstituteArg::SubstituteArg(&local_538);
      strings::internal::SubstituteArg::SubstituteArg(&local_568);
      strings::internal::SubstituteArg::SubstituteArg(&local_598);
      strings::internal::SubstituteArg::SubstituteArg(&local_5c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_5f8);
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"import public \"$0\";\n",&local_448,&local_478,&local_4a8,
                 &local_4d8,&local_508,&local_538,&local_568,&local_598,&local_5c8,&local_5f8);
    }
  }
  package_abi_cxx11_(this);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    this_01 = (vector<int,_std::allocator<int>_> *)((long)&package_comment.prefix_.field_2 + 8);
    std::vector<int,_std::allocator<int>_>::vector(this_01);
    std::vector<int,_std::allocator<int>_>::push_back
              (this_01,&FileDescriptorProto::kPackageFieldNumber);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a88,"",&local_a89);
    anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)local_a68,this,
               (vector<int,_std::allocator<int>_> *)((long)&package_comment.prefix_.field_2 + 8),
               &local_a88,debug_string_options);
    std::__cxx11::string::~string((string *)&local_a88);
    std::allocator<char>::~allocator((allocator<char> *)&local_a89);
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)local_a68,__return_storage_ptr__);
    psVar8 = package_abi_cxx11_(this);
    strings::internal::SubstituteArg::SubstituteArg(&local_ac0,psVar8);
    strings::internal::SubstituteArg::SubstituteArg(&local_af0);
    strings::internal::SubstituteArg::SubstituteArg(&local_b20);
    strings::internal::SubstituteArg::SubstituteArg(&local_b50);
    strings::internal::SubstituteArg::SubstituteArg(&local_b80);
    strings::internal::SubstituteArg::SubstituteArg(&local_bb0);
    strings::internal::SubstituteArg::SubstituteArg(&local_be0);
    strings::internal::SubstituteArg::SubstituteArg(&local_c10);
    strings::internal::SubstituteArg::SubstituteArg(&local_c40);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_c70);
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"package $0;\n\n",&local_ac0,&local_af0,&local_b20,&local_b50,
               &local_b80,&local_bb0,&local_be0,&local_c10,&local_c40,(SubstituteArg *)local_c70);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)local_a68,__return_storage_ptr__);
    anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)local_a68);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)((long)&package_comment.prefix_.field_2 + 8));
  }
  options = FileDescriptor::options(this);
  pool = FileDescriptor::pool(this);
  bVar2 = anon_unknown_1::FormatLineOptions(0,&options->super_Message,pool,__return_storage_ptr__);
  if (bVar2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  for (groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      iVar3 = groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
      iVar4 = enum_type_count(this), iVar3 < iVar4;
      groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    this_02 = enum_type(this,groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    EnumDescriptor::DebugString(this_02,0,__return_storage_ptr__,debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
         *)local_ca8);
  for (local_cac = 0; iVar3 = local_cac, iVar4 = extension_count(this), iVar3 < iVar4;
      local_cac = local_cac + 1) {
    pFVar10 = extension(this,local_cac);
    TVar5 = FieldDescriptor::type(pFVar10);
    if (TVar5 == TYPE_GROUP) {
      pFVar10 = extension(this,local_cac);
      local_cb8 = FieldDescriptor::message_type(pFVar10);
      pVar13 = std::
               set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         *)local_ca8,&local_cb8);
      _Stack_cc8 = pVar13.first._M_node;
      local_cc0 = pVar13.second;
    }
  }
  for (local_ccc = 0; iVar3 = local_ccc, iVar4 = message_type_count(this), iVar3 < iVar4;
      local_ccc = local_ccc + 1) {
    pDStack_cd8 = message_type(this,local_ccc);
    sVar11 = std::
             set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ::count((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)local_ca8,&stack0xfffffffffffff328);
    if (sVar11 == 0) {
      pDVar12 = message_type(this,local_ccc);
      Descriptor::DebugString(pDVar12,0,__return_storage_ptr__,debug_string_options,true);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  for (containing_type._4_4_ = 0; iVar3 = containing_type._4_4_, iVar4 = service_count(this),
      iVar3 < iVar4; containing_type._4_4_ = containing_type._4_4_ + 1) {
    this_03 = service(this,containing_type._4_4_);
    ServiceDescriptor::DebugString(this_03,__return_storage_ptr__,debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pDStack_ce8 = (Descriptor *)0x0;
  for (local_cec = 0; iVar3 = local_cec, iVar4 = extension_count(this), iVar3 < iVar4;
      local_cec = local_cec + 1) {
    pFVar10 = extension(this,local_cec);
    pDVar12 = FieldDescriptor::containing_type(pFVar10);
    if (pDVar12 != pDStack_ce8) {
      if (0 < local_cec) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pFVar10 = extension(this,local_cec);
      pDStack_ce8 = FieldDescriptor::containing_type(pFVar10);
      psVar8 = Descriptor::full_name_abi_cxx11_(pDStack_ce8);
      strings::internal::SubstituteArg::SubstituteArg(&local_d20,psVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_d50);
      strings::internal::SubstituteArg::SubstituteArg(&local_d80);
      strings::internal::SubstituteArg::SubstituteArg(&local_db0);
      strings::internal::SubstituteArg::SubstituteArg(&local_de0);
      strings::internal::SubstituteArg::SubstituteArg(&local_e10);
      strings::internal::SubstituteArg::SubstituteArg(&local_e40);
      strings::internal::SubstituteArg::SubstituteArg(&local_e70);
      strings::internal::SubstituteArg::SubstituteArg(&local_ea0);
      strings::internal::SubstituteArg::SubstituteArg(&local_ed0);
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"extend .$0 {\n",&local_d20,&local_d50,&local_d80,&local_db0
                 ,&local_de0,&local_e10,&local_e40,&local_e70,&local_ea0,&local_ed0);
    }
    pFVar10 = extension(this,local_cec);
    FieldDescriptor::DebugString(pFVar10,1,PRINT_LABEL,__return_storage_ptr__,debug_string_options);
  }
  iVar3 = extension_count(this);
  if (0 < iVar3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_388,__return_storage_ptr__);
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)local_ca8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_410);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_388);
  if ((path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(
        this, path, "", debug_string_options);
    syntax_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                                 SyntaxName(syntax()));
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter
      comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  std::set<int> public_dependencies;
  std::set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                   dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                   dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                   dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(
        this, path, "", debug_string_options);
    package_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  if (FormatLineOptions(0, options(), pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                   containing_type->full_name());
    }
    extension(i)->DebugString(1, FieldDescriptor::PRINT_LABEL, &contents,
                              debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}